

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void wallet::SetPragma(sqlite3 *db,string *key,string *value,string *err_msg)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this;
  char **in_RDI;
  long in_FS_OFFSET;
  int ret;
  string stmt_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff7c;
  string local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff38);
  iVar1 = sqlite3_exec(in_RDI,pcVar2,0,0);
  if (iVar1 == 0) {
    std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
    iVar3 = iVar1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    sqlite3_errstr(iVar1);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff7c,uVar4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar3,in_stack_ffffffffffffff70),in_RDI);
    std::runtime_error::runtime_error(this,local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void SetPragma(sqlite3* db, const std::string& key, const std::string& value, const std::string& err_msg)
{
    std::string stmt_text = strprintf("PRAGMA %s = %s", key, value);
    int ret = sqlite3_exec(db, stmt_text.c_str(), nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: %s: %s\n", err_msg, sqlite3_errstr(ret)));
    }
}